

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
optTyped_valueConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::TestBody
          (optTyped_valueConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  bool bVar1;
  bool *rhs;
  value_type_conflict *lhs;
  char *pcVar2;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  local_20[0] = (internal)0x1;
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_20[0] = (internal)0x1;
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lhs = &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_1;
  local_30.ptr_._0_1_ = *lhs;
  testing::internal::CmpHelperEQ<bool,bool>
            (local_20,"this->value_1","*make()",lhs,(bool *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x182,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
      local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ptr_._0_1_ = *lhs;
  rhs = mp::opt<bool,_mp::opt_default_policy<bool>_>::value
                  ((opt<bool,_mp::opt_default_policy<bool>_> *)&local_30);
  testing::internal::CmpHelperEQ<bool,bool>(local_20,"this->value_1","make().value()",lhs,rhs);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x183,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
      local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ptr_._0_1_ = *lhs;
  testing::internal::CmpHelperEQ<bool,bool>
            (local_20,"this->value_1","make().value_or(this->value_2)",lhs,(bool *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x184,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
      local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TYPED_TEST(optTyped, valueConstructorConstRvalue)
{
  using opt_type = typename TestFixture::type;
  auto make = [&]() -> const opt_type { return opt_type{this->value_1}; };
  EXPECT_TRUE(make());
  EXPECT_TRUE(make().has_value());
  EXPECT_EQ(this->value_1, *make());
  EXPECT_EQ(this->value_1, make().value());
  EXPECT_EQ(this->value_1, make().value_or(this->value_2));
}